

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

bool Minisat::find_executable(char *name)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  char *in_RDI;
  bool bVar2;
  char *path;
  size_t path_len;
  char *q;
  char *dir;
  char *end;
  bool res;
  char *dirs;
  size_t dirs_len;
  char *environment;
  size_t name_len;
  uint6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffa0;
  char *local_50;
  char *local_48;
  bool local_31;
  bool local_1;
  
  strlen(in_RDI);
  __s = getenv("PATH");
  if (__s == (char *)0x0) {
    local_1 = false;
  }
  else {
    sVar1 = strlen(__s);
    __dest = (char *)xrealloc(in_stack_ffffffffffffffa0,
                              CONCAT17(in_stack_ffffffffffffff9f,
                                       CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)
                                      ));
    if (__dest == (char *)0x0) {
      local_1 = false;
    }
    else {
      strcpy(__dest,__s);
      local_31 = false;
      local_48 = __dest;
      while (local_31 == false && local_48 != __dest + sVar1 + 1) {
        local_50 = local_48;
        while( true ) {
          bVar2 = false;
          if (*local_50 != '\0') {
            bVar2 = *local_50 != ':';
          }
          if (!bVar2) break;
          local_50 = local_50 + 1;
        }
        *local_50 = '\0';
        in_stack_ffffffffffffffa0 =
             (char *)xrealloc(in_stack_ffffffffffffffa0,
                              CONCAT17(local_31 == false && local_48 != __dest + sVar1 + 1,
                                       (uint7)in_stack_ffffffffffffff98));
        if (in_stack_ffffffffffffffa0 == (char *)0x0) {
          free(__dest);
          return false;
        }
        sprintf(in_stack_ffffffffffffffa0,"%s/%s",local_48,in_RDI);
        local_31 = file_readable(end);
        free(in_stack_ffffffffffffffa0);
        local_48 = local_50 + 1;
      }
      free(__dest);
      local_1 = local_31;
    }
  }
  return local_1;
}

Assistant:

inline bool find_executable(const char *name)
{
    const size_t name_len = strlen(name);
    const char *environment = getenv("PATH");
    if (!environment) return false;
    const size_t dirs_len = strlen(environment);
    char *dirs = (char *)xrealloc(NULL, dirs_len + 1);
    if (!dirs) return false;
    strcpy(dirs, environment);
    bool res = false;
    const char *end = dirs + dirs_len + 1;
    for (char *dir = dirs, *q; !res && dir != end; dir = q) {
        for (q = dir; *q && *q != ':'; q++) assert(q + 1 < end);
        *q++ = 0;
        const size_t path_len = (q - dir) + name_len;
        char *path = (char *)xrealloc(NULL, path_len + 1);
        if (!path) {
            free(dirs);
            return false;
        }
        sprintf(path, "%s/%s", dir, name);
        assert(strlen(path) == path_len);
        res = file_readable(path);
        free(path);
    }
    free(dirs);
    return res;
}